

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O2

void KeccakP1600OnWords(tKeccakLane *state,uint nrRounds)

{
  uint indexRound;
  
  for (indexRound = 0x18 - nrRounds; indexRound < 0x18; indexRound = indexRound + 1) {
    KeccakP1600Round(state,indexRound);
  }
  return;
}

Assistant:

void KeccakP1600OnWords(tKeccakLane *state, unsigned int nrRounds)
{
    unsigned int i;

#ifdef KeccakReference
    displayStateAsLanes(3, "Same, with lanes as 64-bit words", state, 1600);
#endif

    for(i=(maxNrRounds-nrRounds); i<maxNrRounds; i++)
        KeccakP1600Round(state, i);
}